

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall despot::Parser::PrintObs(Parser *this,OBS_TYPE obs,ostream *out)

{
  pointer pNVar1;
  long lVar2;
  ostream *poVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  pointer *ppbVar8;
  ulong uVar9;
  bool bVar10;
  vector<int,_std::allocator<int>_> obs_vec;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             ((long)(this->obs_vars_).
                    super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->obs_vars_).
                    super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x1111111111111111,&local_49);
  pNVar1 = (this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (int)((ulong)((long)(this->obs_vars_).
                              super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 3) *
          -0x11111111 - 1;
  if (-1 < (int)uVar4) {
    uVar6 = (ulong)uVar4;
    ppbVar8 = (pointer *)
              ((long)&pNVar1[uVar6].super_Variable.values_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              + 8);
    do {
      uVar9 = (ulong)(int)((ulong)((long)*ppbVar8 -
                                  (long)((_Vector_impl_data *)(ppbVar8 + -1))->_M_start) >> 5);
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = (int)(obs % uVar9);
      ppbVar8 = ppbVar8 + -0xf;
      bVar10 = uVar6 != 0;
      uVar6 = uVar6 - 1;
      obs = obs / uVar9;
    } while (bVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  if ((this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      pcVar7 = ", ";
      if (lVar5 == 0) {
        pcVar7 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,(ulong)((uint)(lVar5 != 0) * 2))
      ;
      pNVar1 = (this->obs_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,*(char **)((long)&(pNVar1->name_)._M_dataplus._M_p + lVar5),
                          *(long *)((long)&(pNVar1->name_)._M_string_length + lVar5));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      lVar2 = *(long *)((long)&(((this->obs_vars_).
                                 super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->super_Variable).values_
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       + lVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,*(char **)(lVar2 + (long)local_48.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[uVar6] *
                                           0x20),
                 *(long *)(lVar2 + 8 +
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar6] * 0x20));
      uVar6 = uVar6 + 1;
      uVar9 = ((long)(this->obs_vars_).
                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(this->obs_vars_).
                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
      lVar5 = lVar5 + 0x78;
    } while (uVar6 <= uVar9 && uVar9 - uVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Parser::PrintObs(OBS_TYPE obs, ostream& out) const {
	vector<int> obs_vec(obs_vars_.size());
	for (int o = obs_vars_.size() - 1; o >= 0; o--) {
		obs_vec[o] = obs % obs_vars_[o].Size();
		obs /= obs_vars_[o].Size();
	}

	out << "[";
	for (int o = 0; o < obs_vars_.size(); o++) {
		out << (o == 0 ? "" : ", ") << obs_vars_[o].name() << ":"
			<< obs_vars_[o].GetValue(obs_vec[o]);
	}
	out << "]" << endl;
}